

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool glslang::OutputSpvBin
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,char *baseName)

{
  uint uVar1;
  pointer puVar2;
  int i;
  long lVar3;
  uint word;
  ofstream out;
  uint auStack_210 [120];
  
  std::ofstream::ofstream(&out);
  std::ofstream::open((char *)&out,(_Ios_Openmode)baseName);
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(_out + -0x18));
  if ((uVar1 & 5) == 0) {
    for (lVar3 = 0;
        puVar2 = (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        lVar3 < (int)((ulong)((long)(spirv->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2)
        ; lVar3 = lVar3 + 1) {
      word = puVar2[lVar3];
      std::ostream::write((char *)&out,(long)&word);
    }
    std::ofstream::close();
  }
  else {
    printf("ERROR: Failed to open file: %s\n",baseName);
  }
  std::ofstream::~ofstream(&out);
  return (uVar1 & 5) == 0;
}

Assistant:

bool OutputSpvBin(const std::vector<unsigned int>& spirv, const char* baseName)
{
    std::ofstream out;
    out.open(baseName, std::ios::binary | std::ios::out);
    if (out.fail()) {
        printf("ERROR: Failed to open file: %s\n", baseName);
        return false;
    }
    for (int i = 0; i < (int)spirv.size(); ++i) {
        unsigned int word = spirv[i];
        out.write((const char*)&word, 4);
    }
    out.close();
    return true;
}